

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

int mbedtls_ssl_set_hostname(mbedtls_ssl_context *ssl,char *hostname)

{
  size_t __n;
  char *__dest;
  int iVar1;
  
  iVar1 = -0x7100;
  if (hostname != (char *)0x0) {
    __n = strlen(hostname);
    if (__n < 0x100) {
      __dest = (char *)calloc(1,__n + 1);
      ssl->hostname = __dest;
      if (__dest == (char *)0x0) {
        iVar1 = -0x7f00;
      }
      else {
        memcpy(__dest,hostname,__n);
        __dest[__n] = '\0';
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_ssl_set_hostname( mbedtls_ssl_context *ssl, const char *hostname )
{
    size_t hostname_len;

    if( hostname == NULL )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    hostname_len = strlen( hostname );

    if( hostname_len + 1 == 0 )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    if( hostname_len > MBEDTLS_SSL_MAX_HOST_NAME_LEN )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    ssl->hostname = mbedtls_calloc( 1, hostname_len + 1 );

    if( ssl->hostname == NULL )
        return( MBEDTLS_ERR_SSL_ALLOC_FAILED );

    memcpy( ssl->hostname, hostname, hostname_len );

    ssl->hostname[hostname_len] = '\0';

    return( 0 );
}